

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<unsigned_long_long>>
               (char *label_id,GetterXsYs<unsigned_long_long> *getter,double width)

{
  unsigned_long_long uVar1;
  double dVar2;
  unsigned_long_long uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  unsigned_long_long *puVar9;
  ImPlotPlot *pIVar10;
  ImPlotContext *pIVar11;
  bool bVar12;
  ImU32 col;
  ImU32 col_00;
  long lVar13;
  ImDrawList *this;
  int iVar14;
  int iVar15;
  int iVar16;
  ImPlotRange *pIVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  ImVec2 b;
  ImVec2 a;
  byte local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  unsigned_long_long *local_48;
  double dStack_40;
  
  bVar12 = BeginItem(label_id,1);
  pIVar11 = GImPlot;
  if (bVar12) {
    dVar25 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar14 = getter->Count, 0 < iVar14)) {
      local_48 = getter->Xs;
      puVar9 = getter->Ys;
      iVar16 = getter->Offset;
      iVar5 = getter->Stride;
      pIVar10 = GImPlot->CurrentPlot;
      iVar6 = pIVar10->CurrentYAxis;
      uVar7 = (pIVar10->XAxis).Flags;
      pIVar17 = GImPlot->ExtentsY + iVar6;
      uVar8 = pIVar10->YAxis[iVar6].Flags;
      iVar15 = 0;
      do {
        lVar13 = (long)(((iVar16 + iVar15) % iVar14 + iVar14) % iVar14) * (long)iVar5;
        uVar1 = *(unsigned_long_long *)((long)local_48 + lVar13);
        dVar20 = ((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        uVar1 = *(unsigned_long_long *)((long)puVar9 + lVar13);
        auVar23._8_4_ = (int)(uVar1 >> 0x20);
        auVar23._0_8_ = uVar1;
        auVar23._12_4_ = 0x45300000;
        dVar21 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        dVar22 = dVar20 - dVar25;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001f7f79:
            if ((0.0 < dVar22) || ((uVar7 & 0x20) == 0)) {
              dVar2 = (pIVar11->ExtentsX).Min;
              dVar24 = dVar22;
              if (dVar2 <= dVar22) {
                dVar24 = dVar2;
              }
              (pIVar11->ExtentsX).Min = dVar24;
              dVar2 = (pIVar11->ExtentsX).Max;
              dVar24 = dVar22;
              if (dVar22 <= dVar2) {
                dVar24 = dVar2;
              }
              (pIVar11->ExtentsX).Max = dVar24;
            }
          }
        }
        else if ((((long)ABS(dVar22) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar6].Range.Min <= dVar21)) &&
                (dVar21 <= pIVar10->YAxis[iVar6].Range.Max)) goto LAB_001f7f79;
        if ((uVar8 >> 10 & 1) == 0) {
          if ((uVar1 != 0) || ((uVar8 & 0x20) == 0)) {
LAB_001f7feb:
            dVar22 = dVar21;
            if (pIVar17->Min <= dVar21) {
              dVar22 = pIVar17->Min;
            }
            pIVar17->Min = dVar22;
            dVar22 = pIVar11->ExtentsY[iVar6].Max;
            if (dVar21 <= dVar22) {
              dVar21 = dVar22;
            }
            pIVar11->ExtentsY[iVar6].Max = dVar21;
          }
        }
        else if ((((pIVar10->XAxis).Range.Min <= dVar22) && (dVar22 <= (pIVar10->XAxis).Range.Max))
                && (local_60 = (byte)((uVar8 & 0x20) >> 5), (uVar1 == 0 & local_60) == 0))
        goto LAB_001f7feb;
        dVar20 = dVar20 + dVar25;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar20) < 0x7ff0000000000000) {
LAB_001f803e:
            if ((0.0 < dVar20) || ((uVar7 & 0x20) == 0)) {
              dVar21 = (pIVar11->ExtentsX).Min;
              dVar22 = dVar20;
              if (dVar21 <= dVar20) {
                dVar22 = dVar21;
              }
              (pIVar11->ExtentsX).Min = dVar22;
              dVar21 = (pIVar11->ExtentsX).Max;
              dVar22 = dVar20;
              if (dVar20 <= dVar21) {
                dVar22 = dVar21;
              }
              (pIVar11->ExtentsX).Max = dVar22;
            }
          }
        }
        else if ((((long)ABS(dVar20) < 0x7ff0000000000000) &&
                 (pIVar10->YAxis[iVar6].Range.Min <= 0.0)) &&
                (0.0 <= pIVar10->YAxis[iVar6].Range.Max)) goto LAB_001f803e;
        if ((uVar8 >> 10 & 1) == 0) {
          if ((uVar8 & 0x20) == 0) {
LAB_001f80a4:
            dVar21 = 0.0;
            if (pIVar17->Min <= 0.0) {
              dVar21 = pIVar17->Min;
            }
            pIVar17->Min = dVar21;
            dVar21 = pIVar11->ExtentsY[iVar6].Max;
            dVar20 = 0.0;
            if (0.0 <= dVar21) {
              dVar20 = dVar21;
            }
            pIVar11->ExtentsY[iVar6].Max = dVar20;
          }
        }
        else if ((((uVar8 & 0x20) == 0) && ((pIVar10->XAxis).Range.Min <= dVar20)) &&
                (dVar20 <= (pIVar10->XAxis).Range.Max)) goto LAB_001f80a4;
        iVar15 = iVar15 + 1;
      } while (iVar14 != iVar15);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar11->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar11->NextItemData).Colors + 1);
    iVar14 = getter->Count;
    if (0 < iVar14) {
      bVar12 = (pIVar11->NextItemData).RenderFill;
      bVar4 = (pIVar11->NextItemData).RenderLine;
      iVar16 = 0;
      do {
        lVar13 = (long)(((getter->Offset + iVar16) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride;
        uVar1 = *(unsigned_long_long *)((long)getter->Ys + lVar13);
        if (uVar1 != 0) {
          auVar18._8_4_ = (int)(uVar1 >> 0x20);
          auVar18._0_8_ = uVar1;
          auVar18._12_4_ = 0x45300000;
          uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar13);
          auVar19._8_4_ = (int)(uVar3 >> 0x20);
          auVar19._0_8_ = uVar3;
          auVar19._12_4_ = 0x45300000;
          dStack_40 = auVar19._8_8_ - 1.9342813113834067e+25;
          local_48 = (unsigned_long_long *)
                     (dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
          local_50 = PlotToPixels((double)local_48 - dVar25,
                                  (auVar18._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0),-1)
          ;
          local_58 = PlotToPixels((double)local_48 + dVar25,0.0,-1);
          if ((pIVar11->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_50,&local_58,col_00,0.0,0);
          }
          if (((bVar12 ^ 1U | col != col_00) & bVar4) != 0) {
            ImDrawList::AddRect(this,&local_50,&local_58,col,0.0,0xf0,
                                (pIVar11->NextItemData).LineWeight);
          }
        }
        iVar16 = iVar16 + 1;
        iVar14 = getter->Count;
      } while (iVar16 < iVar14);
    }
    pIVar11 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar11->NextItemData);
    pIVar11->PreviousItem = pIVar11->CurrentItem;
    pIVar11->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}